

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O0

void __thiscall adios2::transport::FileStdio::Truncate(FileStdio *this,size_t length)

{
  __off_t in_RSI;
  long in_RDI;
  int status;
  int fd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_120 [24];
  unsigned_long in_stack_fffffffffffffef8;
  string local_100 [4];
  int in_stack_ffffffffffffff04;
  string *in_stack_ffffffffffffff08;
  FileStdio *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  string local_c0 [39];
  undefined1 local_99 [40];
  undefined1 local_71 [56];
  allocator local_39;
  string local_38 [32];
  int local_18;
  int local_14;
  __off_t local_10;
  
  local_10 = in_RSI;
  WaitForOpen(in_stack_ffffffffffffff10);
  local_14 = fileno(*(FILE **)(in_RDI + 0xf0));
  local_18 = ftruncate(local_14,local_10);
  if (local_18 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Toolkit",&local_39);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_71 + 1),"transport::file::FileStdio",(allocator *)__lhs);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_99 + 1),"Truncate",(allocator *)__rhs);
    std::__cxx11::to_string(in_stack_fffffffffffffef8);
    std::operator+((char *)__lhs,__rhs);
    std::operator+(__lhs,(char *)__rhs);
    std::operator+(__lhs,__rhs);
    helper::Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               (string *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               in_stack_ffffffffffffff04);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string((string *)(local_99 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_99);
    std::__cxx11::string::~string((string *)(local_71 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return;
}

Assistant:

void FileStdio::Truncate(const size_t length)
{

    WaitForOpen();
    int fd = fileno(m_File);
    const auto status = ftruncate(fd, length);
    if (status == -1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "Truncate",
                                              "couldn't truncate to " + std::to_string(length) +
                                                  " of file " + m_Name);
    }
}